

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

int Ver_ParseMaxBoxSize(Vec_Ptr_t *vUndefs)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  undefined4 local_2c;
  undefined4 local_28;
  int nMaxSize;
  int k;
  int i;
  Abc_Obj_t *pBox;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *vUndefs_local;
  
  local_2c = 0;
  for (nMaxSize = 0; iVar1 = Vec_PtrSize(vUndefs), nMaxSize < iVar1; nMaxSize = nMaxSize + 1) {
    pvVar2 = Vec_PtrEntry(vUndefs,nMaxSize);
    for (local_28 = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar2 + 0x158)), local_28 < iVar1;
        local_28 = local_28 + 1) {
      pvVar3 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar2 + 0x158),local_28);
      iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar3 + 0x40));
      if (local_2c < iVar1) {
        local_2c = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar3 + 0x40));
      }
    }
  }
  return local_2c;
}

Assistant:

int Ver_ParseMaxBoxSize( Vec_Ptr_t * vUndefs )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pBox;
    int i, k, nMaxSize = 0;
    // go through undef box types
    Vec_PtrForEachEntry( Abc_Ntk_t *, vUndefs, pNtk, i )
        // go through instances of this type
        Vec_PtrForEachEntry( Abc_Obj_t *, (Vec_Ptr_t *)pNtk->pData, pBox, k )
            // check the number of bundles of this instance
            if ( nMaxSize < Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy) )
                nMaxSize = Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy);
    return nMaxSize;
}